

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall
groundupdbext::FileKeyValueStore::loadKeysInto
          (FileKeyValueStore *this,
          function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)> *callback)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  size_t sVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  pointer __source;
  path *ppVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  EncodedValue local_618;
  allocator local_5d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  undefined1 local_5b0 [8];
  HashedKey key;
  unsigned_long i;
  char *cstr;
  char *cdata;
  stringstream sstream;
  ifstream local_3d8 [8];
  ifstream t;
  string local_1d0 [8];
  string strhash;
  undefined1 local_188 [8];
  string hashWithExtension;
  path local_140;
  directory_entry *local_118;
  directory_entry *p;
  undefined1 local_100 [8];
  directory_iterator __end1;
  undefined1 local_e0 [8];
  directory_iterator __begin1;
  directory_iterator *__range1;
  undefined1 local_a8 [8];
  path fp;
  size_t hash;
  string eol;
  string data;
  string type;
  function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)> *callback_local;
  FileKeyValueStore *this_local;
  
  std::__cxx11::string::string((string *)(data.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(eol.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&hash);
  __source = std::
             unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
             ::operator->(&this->mImpl);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_a8,&__source->m_fullpath,auto_format);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount,(path *)local_a8);
  __rhs = &__begin1._M_dir._M_refcount;
  Catch::clara::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,(directory_iterator *)__rhs);
  Catch::clara::std::filesystem::__cxx11::begin
            ((__cxx11 *)local_e0,(directory_iterator *)&__end1._M_dir._M_refcount);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&p,(directory_iterator *)__rhs);
  Catch::clara::std::filesystem::__cxx11::end((directory_iterator *)local_100);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&p);
  while (bVar2 = Catch::clara::std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_e0,(directory_iterator *)local_100), bVar2)
  {
    local_118 = (directory_entry *)
                std::filesystem::__cxx11::directory_iterator::operator*
                          ((directory_iterator *)local_e0);
    bVar2 = std::filesystem::__cxx11::directory_entry::exists((directory_entry *)local_118);
    if ((bVar2) &&
       (bVar2 = std::filesystem::__cxx11::directory_entry::is_regular_file
                          ((directory_entry *)local_118), bVar2)) {
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_140,(char (*) [5])".key",auto_format);
      ppVar4 = Catch::clara::std::filesystem::__cxx11::directory_entry::path(local_118);
      std::filesystem::__cxx11::path::extension
                ((path *)((long)&hashWithExtension.field_2 + 8),(path *)ppVar4);
      bVar2 = std::filesystem::__cxx11::operator==
                        (&local_140,(path *)((long)&hashWithExtension.field_2 + 8));
      Catch::clara::std::filesystem::__cxx11::path::~path
                ((path *)((long)&hashWithExtension.field_2 + 8));
      Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_140);
      if (bVar2) {
        ppVar4 = Catch::clara::std::filesystem::__cxx11::directory_entry::path(local_118);
        std::filesystem::__cxx11::path::filename
                  ((path *)((long)&strhash.field_2 + 8),(path *)ppVar4);
        std::filesystem::__cxx11::path::string
                  ((string *)local_188,(path *)((long)&strhash.field_2 + 8));
        Catch::clara::std::filesystem::__cxx11::path::~path((path *)((long)&strhash.field_2 + 8));
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_188);
        ppVar4 = Catch::clara::std::filesystem::__cxx11::directory_entry::path(local_118);
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  (local_3d8,(path *)ppVar4,_S_in);
        std::operator>>((istream *)local_3d8,(string *)(data.field_2._M_local_buf + 8));
        std::operator>>((istream *)local_3d8,(string *)(eol.field_2._M_local_buf + 8));
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)&cdata,local_1d0,_Var3);
        std::istream::operator>>(&cdata,(ulong *)&fp._M_cmpts);
        uVar5 = std::__cxx11::string::length();
        pcVar6 = (char *)operator_new__(uVar5);
        lVar7 = std::__cxx11::string::c_str();
        for (key.m_hash = 0; sVar1 = key.m_hash, uVar5 = std::__cxx11::string::length(),
            sVar1 < uVar5; key.m_hash = key.m_hash + 1) {
          pcVar6[key.m_hash] = *(char *)(lVar7 + key.m_hash);
        }
        uVar5 = std::__cxx11::string::length();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5d0,pcVar6,uVar5,&local_5d1);
        groundupdb::HashedValue::HashedValue<std::__cxx11::string>
                  ((HashedValue *)local_5b0,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
        bVar2 = std::operator==("set",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&data.field_2 + 8));
        if (!bVar2) {
          (*(this->super_KeyValueStore).super_Store._vptr_Store[3])(&local_618,this,local_5b0);
          std::function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)>::
          operator()(callback,(HashedValue *)local_5b0,&local_618);
          groundupdb::EncodedValue::~EncodedValue(&local_618);
        }
        groundupdb::HashedValue::~HashedValue((HashedValue *)local_5b0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&cdata);
        std::ifstream::~ifstream(local_3d8);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string((string *)local_188);
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_e0);
  }
  Catch::clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_100);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_e0);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)local_a8);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)(eol.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
FileKeyValueStore::loadKeysInto(
    std::function<void(const HashedValue& key,EncodedValue value)> callback)
{
  std::string type;
  std::string data;
  std::string eol; // eol can be multiple characters
  std::size_t hash;
  // load any files with .kv in their name
  fs::path fp(mImpl->m_fullpath);
  for (auto& p : fs::directory_iterator(fp)) {
    if (p.exists() && p.is_regular_file()) {
      // check if extension is .kv
      if(".key" == p.path().extension()) {
        // If so, open file

        std::string hashWithExtension = p.path().filename().string();
        // ASSUMPTION always ends with .kv
        std::string strhash = hashWithExtension.substr(0,hashWithExtension.length() - 4); // BUG0000001
        // TODO check that file name is long enough
        // TODO check that file exists before opening

        std::ifstream t(p.path());
        t >> type;
        t >> data;
        // Construct hashed key
        std::stringstream sstream(strhash);
        sstream >> hash;
        char* cdata = new char[data.length()];
        const char* cstr = data.c_str();
        for (unsigned long i = 0;i < data.length();i++) {
          cdata[i] = cstr[i];
        }
        HashedKey key(std::string(cdata,data.length()));
        if ("set" == type) {
          // TODO support set as an encoded value
          //callback(key,getKeyValueSet(key));
        } else {
          callback(key,getKeyValue(key));
        }
      }
    }
  }
}